

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

bool __thiscall HEkk::proofOfPrimalInfeasibility(HEkk *this)

{
  HighsInt iRow;
  HighsInt move_out;
  bool bVar1;
  HighsInt in_ECX;
  HVector row_ep;
  HVectorBase<double> HStack_c8;
  
  iRow = (this->dual_ray_record_).index;
  move_out = (this->dual_ray_record_).sign;
  HStack_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HStack_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HStack_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  HStack_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  HStack_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HStack_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HStack_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  HStack_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HStack_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&HStack_c8,(this->lp_).num_row_);
  unitBtran(this,iRow,&HStack_c8);
  bVar1 = proofOfPrimalInfeasibility(this,&HStack_c8,move_out,in_ECX);
  if (HStack_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(HStack_c8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (HStack_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(HStack_c8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (HStack_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(HStack_c8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (HStack_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(HStack_c8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (HStack_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(HStack_c8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (HStack_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(HStack_c8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility() {
  // To be called from outside HEkk when row_ep is not known
  assert(dual_ray_record_.index >= 0);
  HighsLp& lp = this->lp_;
  HighsInt move_out = dual_ray_record_.sign;
  HighsInt row_out = dual_ray_record_.index;
  // Compute the basis inverse row
  HVector row_ep;
  row_ep.setup(lp.num_row_);
  unitBtran(row_out, row_ep);
  return proofOfPrimalInfeasibility(row_ep, move_out, row_out);
}